

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void check_start_used_ptr(compiler_common *common)

{
  sljit_compiler *compiler_00;
  sljit_jump *psVar1;
  sljit_label *psVar2;
  sljit_jump *jump;
  sljit_compiler *compiler;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  if (common->mode == 2) {
    sljit_emit_op2(compiler_00,0x60,1,0,0x8e,(long)common->start_used_ptr,0x40,1);
    psVar1 = sljit_emit_cmp(compiler_00,5,1,0,2,0);
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->start_used_ptr,2,0);
    psVar2 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar1,psVar2);
  }
  else if (common->mode == 4) {
    psVar1 = sljit_emit_cmp(compiler_00,5,0x8e,(long)common->start_used_ptr,2,0);
    sljit_emit_op1(compiler_00,0x20,0x8e,(long)common->start_used_ptr,2,0);
    psVar2 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar1,psVar2);
  }
  return;
}

Assistant:

static SLJIT_INLINE void check_start_used_ptr(compiler_common *common)
{
/* May destroy TMP1. */
DEFINE_COMPILER;
struct sljit_jump *jump;

if (common->mode == PCRE2_JIT_PARTIAL_SOFT)
  {
  /* The value of -1 must be kept for start_used_ptr! */
  OP2(SLJIT_ADD, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, SLJIT_IMM, 1);
  /* Jumps if start_used_ptr < STR_PTR, or start_used_ptr == -1. Although overwriting
  is not necessary if start_used_ptr == STR_PTR, it does not hurt as well. */
  jump = CMP(SLJIT_LESS_EQUAL, TMP1, 0, STR_PTR, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, STR_PTR, 0);
  JUMPHERE(jump);
  }
else if (common->mode == PCRE2_JIT_PARTIAL_HARD)
  {
  jump = CMP(SLJIT_LESS_EQUAL, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, STR_PTR, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, STR_PTR, 0);
  JUMPHERE(jump);
  }
}